

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O2

EGUI_BUTTON_IMAGE_STATE __thiscall
irr::gui::CGUIButton::getImageState(CGUIButton *this,bool pressed)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  EGUI_BUTTON_IMAGE_STATE EVar4;
  CGUIButton *pCVar5;
  EGUI_BUTTON_IMAGE_STATE EVar6;
  
  bVar1 = (**(code **)(**(long **)&this->field_0x128 + 0x28))(*(long **)&this->field_0x128,this,0);
  pCVar5 = (CGUIButton *)(**(code **)(**(long **)&this->field_0x128 + 0x18))();
  cVar2 = (**(code **)(*(long *)this + 0x90))(this);
  if (cVar2 == '\0') {
    EVar4 = EGBIS_IMAGE_DISABLED;
  }
  else {
    bVar3 = pCVar5 == this & bVar1;
    if (pressed) {
      if (bVar3 != 0) {
        EVar4 = EGBIS_IMAGE_DOWN_FOCUSED_MOUSEOVER;
        goto LAB_002250a3;
      }
      EVar6 = pCVar5 == this | EGBIS_IMAGE_DOWN;
      EVar4 = EGBIS_IMAGE_DOWN_FOCUSED;
    }
    else {
      if (bVar3 != 0) {
        EVar4 = EGBIS_IMAGE_UP_FOCUSED_MOUSEOVER;
        goto LAB_002250a3;
      }
      EVar6 = (EGUI_BUTTON_IMAGE_STATE)(pCVar5 == this);
      EVar4 = EGBIS_IMAGE_UP_FOCUSED;
    }
    if (bVar1 == 0) {
      EVar4 = EVar6;
    }
  }
LAB_002250a3:
  do {
    EVar6 = EVar4;
    if ((EVar6 == EGBIS_IMAGE_UP) || (this->ButtonImages[EVar6].Texture != (ITexture *)0x0)) {
      return EVar6;
    }
    EVar4 = EGBIS_IMAGE_UP_MOUSEOVER;
    switch(EVar6) {
    case EGBIS_IMAGE_UP_FOCUSED:
      break;
    case EGBIS_IMAGE_UP_FOCUSED_MOUSEOVER:
      EVar4 = EGBIS_IMAGE_UP_FOCUSED;
      break;
    default:
      EVar4 = EGBIS_IMAGE_UP;
      break;
    case EGBIS_IMAGE_DOWN_MOUSEOVER:
      EVar4 = EGBIS_IMAGE_DOWN;
      break;
    case EGBIS_IMAGE_DOWN_FOCUSED:
      EVar4 = EGBIS_IMAGE_DOWN_MOUSEOVER;
      break;
    case EGBIS_IMAGE_DOWN_FOCUSED_MOUSEOVER:
      EVar4 = EGBIS_IMAGE_DOWN_FOCUSED;
      break;
    case EGBIS_IMAGE_DISABLED:
      EVar4 = (uint)pressed << 2;
    }
  } while( true );
}

Assistant:

EGUI_BUTTON_IMAGE_STATE CGUIButton::getImageState(bool pressed) const
{
	// figure state we should have
	EGUI_BUTTON_IMAGE_STATE state = EGBIS_IMAGE_DISABLED;
	bool focused = Environment->hasFocus(this);
	bool mouseOver = static_cast<const IGUIElement *>(Environment->getHovered()) == this; // (static cast for Borland)
	if (isEnabled()) {
		if (pressed) {
			if (focused && mouseOver)
				state = EGBIS_IMAGE_DOWN_FOCUSED_MOUSEOVER;
			else if (focused)
				state = EGBIS_IMAGE_DOWN_FOCUSED;
			else if (mouseOver)
				state = EGBIS_IMAGE_DOWN_MOUSEOVER;
			else
				state = EGBIS_IMAGE_DOWN;
		} else // !pressed
		{
			if (focused && mouseOver)
				state = EGBIS_IMAGE_UP_FOCUSED_MOUSEOVER;
			else if (focused)
				state = EGBIS_IMAGE_UP_FOCUSED;
			else if (mouseOver)
				state = EGBIS_IMAGE_UP_MOUSEOVER;
			else
				state = EGBIS_IMAGE_UP;
		}
	}

	// find a compatible state that has images
	while (state != EGBIS_IMAGE_UP && !ButtonImages[(u32)state].Texture) {
		switch (state) {
		case EGBIS_IMAGE_UP_FOCUSED:
			state = EGBIS_IMAGE_UP_MOUSEOVER;
			break;
		case EGBIS_IMAGE_UP_FOCUSED_MOUSEOVER:
			state = EGBIS_IMAGE_UP_FOCUSED;
			break;
		case EGBIS_IMAGE_DOWN_MOUSEOVER:
			state = EGBIS_IMAGE_DOWN;
			break;
		case EGBIS_IMAGE_DOWN_FOCUSED:
			state = EGBIS_IMAGE_DOWN_MOUSEOVER;
			break;
		case EGBIS_IMAGE_DOWN_FOCUSED_MOUSEOVER:
			state = EGBIS_IMAGE_DOWN_FOCUSED;
			break;
		case EGBIS_IMAGE_DISABLED:
			if (pressed)
				state = EGBIS_IMAGE_DOWN;
			else
				state = EGBIS_IMAGE_UP;
			break;
		default:
			state = EGBIS_IMAGE_UP;
		}
	}

	return state;
}